

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

void __thiscall SQBlob::SQBlob(SQBlob *this,SQInteger size)

{
  _func_int **pp_Var1;
  _func_int **in_RSI;
  SQStream *in_RDI;
  
  SQStream::SQStream(in_RDI);
  in_RDI->_vptr_SQStream = (_func_int **)&PTR__SQBlob_00153d20;
  in_RDI[1]._vptr_SQStream = in_RSI;
  in_RDI[2]._vptr_SQStream = in_RSI;
  pp_Var1 = (_func_int **)sq_malloc(0x143348);
  in_RDI[4]._vptr_SQStream = pp_Var1;
  memset(in_RDI[4]._vptr_SQStream,0,(size_t)in_RDI[1]._vptr_SQStream);
  in_RDI[3]._vptr_SQStream = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[5]._vptr_SQStream = 1;
  return;
}

Assistant:

SQBlob(SQInteger size) {
        _size = size;
        _allocated = size;
        _buf = (unsigned char *)sq_malloc(size);
        memset(_buf, 0, _size);
        _ptr = 0;
        _owns = true;
    }